

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O1

bool __thiscall
FpgaIO::WriteRTL8211F_Register(FpgaIO *this,uint chan,uint phyAddr,uint regAddr,uint16_t data)

{
  BasePort *pBVar1;
  bool bVar2;
  int iVar3;
  
  bVar2 = WaitRTL8211F_Idle(this,"WriteRTL8211F_Register",chan,0x14);
  if (bVar2) {
    pBVar1 = (this->super_BoardIO).port;
    iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,(ulong)(chan << 8 | 0x40a0),
                       (ulong)((uint)data + ((regAddr & 0x1f) << 0x12 | (phyAddr & 0x1f) << 0x17) +
                              0x50020000));
    return SUB41(iVar3,0);
  }
  return false;
}

Assistant:

bool FpgaIO::WriteRTL8211F_Register(unsigned int chan, unsigned int phyAddr, unsigned int regAddr, uint16_t data)
{
    // Should have firmware/hardware checks
    // Wait for FPGA mdio interface to be idle
    if (!WaitRTL8211F_Idle("WriteRTL8211F_Register", chan, 20))
        return false;
    nodeaddr_t address = 0x40a0 | (chan << 8);
    // Format: 0101 PPPP PRRR RR10 D(16), where P indicates phyAddr, R indicates regAddr, D indicates data
    uint32_t write_data = 0x50020000 | ((phyAddr&0x1f) << 23) | ((regAddr&0x1f) << 18) | data;
    return port->WriteQuadlet(BoardId, address, write_data);
}